

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeT2LoadImm8(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t RegNo;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  DecodeStatus DVar6;
  uint imm;
  uint U;
  uint Rt;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rt = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0x10,4);
  RegNo = fieldFromInstruction_4(Address_local._4_4_,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,9,1);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0,8);
  if (uVar2 == 0xf) {
    uVar5 = MCInst_getOpcode(pMStack_18);
    if (uVar5 == 0x946) {
      MCInst_setOpcode(pMStack_18,0x947);
    }
    else if (uVar5 == 0x955) {
      MCInst_setOpcode(pMStack_18,0x956);
    }
    else if (uVar5 == 0x95d) {
      MCInst_setOpcode(pMStack_18,0x95e);
    }
    else if (uVar5 == 0x965) {
      MCInst_setOpcode(pMStack_18,0x966);
    }
    else if (uVar5 == 0x96d) {
      MCInst_setOpcode(pMStack_18,0x96e);
    }
    else if (uVar5 == 0x9ae) {
      MCInst_setOpcode(pMStack_18,0x9af);
    }
    else {
      if (uVar5 != 0x9b2) {
        return MCDisassembler_Fail;
      }
      MCInst_setOpcode(pMStack_18,0x9b3);
    }
    Inst_local._4_4_ = DecodeT2LoadLabel(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Rn)
    ;
  }
  else if ((RegNo == 0xf) && (uVar5 = MCInst_getOpcode(pMStack_18), uVar5 == 0x965)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar5 = MCInst_getOpcode(pMStack_18);
    if ((uVar5 != 0x9ab) && ((uVar5 != 0x9ae && (uVar5 != 0x9b2)))) {
      DVar6 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rt,DVar6);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar6 = DecodeT2AddrModeImm8
                      (pMStack_18,uVar2 << 9 | uVar3 << 8 | uVar4,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rt,DVar6);
    if (_Var1) {
      Inst_local._4_4_ = Rt;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeT2LoadImm8(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 9, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	imm |= (U << 8);
	imm |= (Rn << 9);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi8:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2PLDi8:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi8:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi8:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi8:
		case ARM_t2PLIi8:
		case ARM_t2PLDWi8:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}